

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O0

SENode * __thiscall
spvtools::opt::ScalarEvolutionAnalysis::AnalyzeInstruction
          (ScalarEvolutionAnalysis *this,Instruction *inst)

{
  bool bVar1;
  Op OVar2;
  pointer ppVar3;
  ScalarEvolutionAnalysis *local_38;
  SENode *output;
  _Self local_28;
  iterator itr;
  Instruction *inst_local;
  ScalarEvolutionAnalysis *this_local;
  
  itr._M_node = (_Base_ptr)inst;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<const_spvtools::opt::Instruction_*,_spvtools::opt::SENode_*,_std::less<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>_>_>
       ::find(&this->recurrent_node_map_,(key_type *)&itr);
  output = (SENode *)
           std::
           map<const_spvtools::opt::Instruction_*,_spvtools::opt::SENode_*,_std::less<const_spvtools::opt::Instruction_*>,_std::allocator<std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>_>_>
           ::end(&this->recurrent_node_map_);
  bVar1 = std::operator!=(&local_28,(_Self *)&output);
  if (bVar1) {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_spvtools::opt::Instruction_*const,_spvtools::opt::SENode_*>_>
             ::operator->(&local_28);
    this_local = (ScalarEvolutionAnalysis *)ppVar3->second;
  }
  else {
    OVar2 = opt::Instruction::opcode((Instruction *)itr._M_node);
    if ((OVar2 == OpConstant) || (OVar2 == OpConstantNull)) {
      local_38 = (ScalarEvolutionAnalysis *)AnalyzeConstant(this,(Instruction *)itr._M_node);
    }
    else if ((OVar2 == OpIAdd) || (OVar2 == OpISub)) {
      local_38 = (ScalarEvolutionAnalysis *)AnalyzeAddOp(this,(Instruction *)itr._M_node);
    }
    else if (OVar2 == OpIMul) {
      local_38 = (ScalarEvolutionAnalysis *)AnalyzeMultiplyOp(this,(Instruction *)itr._M_node);
    }
    else if (OVar2 == OpPhi) {
      local_38 = (ScalarEvolutionAnalysis *)AnalyzePhiInstruction(this,(Instruction *)itr._M_node);
    }
    else {
      local_38 = (ScalarEvolutionAnalysis *)CreateValueUnknownNode(this,(Instruction *)itr._M_node);
    }
    this_local = local_38;
  }
  return (SENode *)this_local;
}

Assistant:

SENode* ScalarEvolutionAnalysis::AnalyzeInstruction(const Instruction* inst) {
  auto itr = recurrent_node_map_.find(inst);
  if (itr != recurrent_node_map_.end()) return itr->second;

  SENode* output = nullptr;
  switch (inst->opcode()) {
    case spv::Op::OpPhi: {
      output = AnalyzePhiInstruction(inst);
      break;
    }
    case spv::Op::OpConstant:
    case spv::Op::OpConstantNull: {
      output = AnalyzeConstant(inst);
      break;
    }
    case spv::Op::OpISub:
    case spv::Op::OpIAdd: {
      output = AnalyzeAddOp(inst);
      break;
    }
    case spv::Op::OpIMul: {
      output = AnalyzeMultiplyOp(inst);
      break;
    }
    default: {
      output = CreateValueUnknownNode(inst);
      break;
    }
  }

  return output;
}